

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.c
# Opt level: O1

el_action_t ce_inc_search(EditLine *el,wchar_t dir)

{
  wchar_t **ppwVar1;
  byte bVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  byte bVar6;
  byte bVar7;
  el_action_t eVar8;
  el_action_t eVar9;
  uint uVar10;
  wchar_t wVar11;
  wchar_t *pwVar12;
  wchar_t *pwVar13;
  void *pvVar14;
  wchar_t *pwVar15;
  el_line_t *peVar16;
  wchar_t dir_00;
  wchar_t ch;
  wchar_t local_5c;
  wchar_t local_58;
  wchar_t local_54;
  wchar_t *local_50;
  size_t local_48;
  el_line_t *local_40;
  size_t local_38;
  
  bVar7 = ce_inc_search_pchar;
  local_38 = (el->el_search).patlen;
  if ((el->el_line).lastchar + local_38 + 6 < (el->el_line).limit) {
    local_40 = &el->el_line;
    local_50 = (el->el_line).cursor;
    local_54 = (el->el_history).eventno;
    ppwVar1 = &(el->el_line).lastchar;
    eVar8 = '\0';
    dir_00 = dir;
    do {
      if ((el->el_search).patlen == 0) {
        ce_inc_search_pchar = 0;
        pwVar12 = (el->el_search).patbuf;
        (el->el_search).patlen = 1;
        *pwVar12 = L'.';
        (el->el_search).patlen = 2;
        pwVar12[1] = L'*';
      }
      pwVar12 = *ppwVar1;
      *ppwVar1 = pwVar12 + 1;
      *pwVar12 = L'\n';
      pwVar12 = L"fwd";
      if (dir_00 == L'\x18') {
        pwVar12 = L"bck";
      }
      wVar11 = *pwVar12;
      if (wVar11 != L'\0') {
        pwVar15 = *ppwVar1;
        do {
          pwVar12 = pwVar12 + 1;
          *pwVar15 = wVar11;
          pwVar15 = pwVar15 + 1;
          wVar11 = *pwVar12;
        } while (wVar11 != L'\0');
        *ppwVar1 = pwVar15;
      }
      uVar10 = (uint)ce_inc_search_pchar;
      pwVar12 = (el->el_line).lastchar;
      (el->el_line).lastchar = pwVar12 + 1;
      *pwVar12 = uVar10 * 5 + L':';
      sVar3 = (el->el_search).patlen;
      if (2 < (long)sVar3) {
        pwVar12 = (el->el_search).patbuf;
        pwVar13 = pwVar12 + 2;
        pwVar15 = *ppwVar1;
        do {
          wVar11 = *pwVar13;
          pwVar13 = pwVar13 + 1;
          *pwVar15 = wVar11;
          pwVar15 = pwVar15 + 1;
        } while (pwVar13 < pwVar12 + sVar3);
        *ppwVar1 = pwVar15;
      }
      *(el->el_line).lastchar = L'\0';
      re_refresh(el);
      wVar11 = el_wgetc(el,&local_5c);
      if (wVar11 != L'\x01') {
        eVar8 = ed_end_of_file(el,0);
        return eVar8;
      }
      bVar2 = (el->el_map).current[(uint)(local_5c & 0xff)];
      if (bVar2 < 0x22) {
        if (bVar2 == 4) {
LAB_0010eeb8:
          if ((el->el_search).patlen < 3) {
LAB_0010eec7:
            terminal_beep(el);
            goto LAB_0010eecf;
          }
          bVar5 = true;
        }
        else if ((bVar2 == 6) || (bVar2 == 9)) {
          uVar4 = (el->el_search).patlen;
          if (0x3fd < uVar4) goto LAB_0010eec7;
          (el->el_search).patlen = uVar4 + 1;
          (el->el_search).patbuf[uVar4] = local_5c;
          pwVar12 = (el->el_line).lastchar;
          (el->el_line).lastchar = pwVar12 + 1;
          *pwVar12 = local_5c;
          pwVar12[1] = L'\0';
LAB_0010ee8f:
          re_refresh(el);
LAB_0010eecf:
          bVar5 = false;
        }
        else {
LAB_0010eed9:
          bVar5 = true;
          if (local_5c == L'\a') {
            eVar8 = '\x06';
          }
          else {
            if (local_5c != L'\x1b') {
              if (local_5c == L'\x17') {
                local_48 = (el->el_search).patlen;
                local_58 = dir;
                if (2 < (long)local_48) {
                  pwVar15 = (el->el_search).patbuf;
                  pwVar12 = pwVar15 + local_48;
                  pwVar15 = pwVar15 + 2;
                  do {
                    pvVar14 = memchr("*[]?",*pwVar15,5);
                    if (pvVar14 != (void *)0x0) {
                      terminal_beep(el);
                      goto LAB_0010f2da;
                    }
                    pwVar15 = pwVar15 + 1;
                  } while (pwVar15 < pwVar12);
                }
                pwVar12 = (el->el_line).cursor;
                if (pwVar12 == (el->el_line).buffer) {
LAB_0010f2da:
                  bVar5 = false;
                  bVar6 = 0;
                  dir = local_58;
                  goto LAB_0010eff0;
                }
                pwVar12 = pwVar12 + (local_48 - 3);
                (el->el_line).cursor = pwVar12;
                pwVar15 = c__next_word(pwVar12,(el->el_line).lastchar,L'\x01',ce__isword);
                dir = local_58;
                pwVar12 = (el->el_line).cursor;
                while( true ) {
                  if ((pwVar15 <= pwVar12) || (wVar11 = *pwVar12, wVar11 == L'\n'))
                  goto LAB_0010f2f1;
                  uVar4 = (el->el_search).patlen;
                  if (0x3fd < uVar4) break;
                  (el->el_search).patlen = uVar4 + 1;
                  (el->el_search).patbuf[uVar4] = wVar11;
                  (el->el_line).cursor = pwVar12 + 1;
                  wVar11 = *pwVar12;
                  pwVar13 = (el->el_line).lastchar;
                  (el->el_line).lastchar = pwVar13 + 1;
                  *pwVar13 = wVar11;
                  pwVar12 = pwVar12 + 1;
                }
                terminal_beep(el);
LAB_0010f2f1:
                (el->el_line).cursor = local_50;
                *(el->el_line).lastchar = L'\0';
                goto LAB_0010ee8f;
              }
              ce_inc_search::endcmd[0] = local_5c;
              el_wpush(el,ce_inc_search::endcmd);
            }
            eVar8 = '\x04';
          }
        }
        bVar6 = 0;
      }
      else {
        if (bVar2 == 0x22) goto LAB_0010eeb8;
        bVar6 = 1;
        if (bVar2 == 0x25) {
          dir_00 = L'\x17';
        }
        else {
          if (bVar2 != 0x26) goto LAB_0010eed9;
          dir_00 = L'\x18';
        }
        bVar5 = false;
      }
LAB_0010eff0:
      pwVar12 = local_40->buffer;
      pwVar15 = *ppwVar1;
      while ((pwVar12 < pwVar15 && (*pwVar15 != L'\n'))) {
        *ppwVar1 = pwVar15 + -1;
        *pwVar15 = L'\0';
        pwVar15 = pwVar15 + -1;
      }
      *pwVar15 = L'\0';
      if (!bVar5) {
        pwVar15 = (el->el_search).patbuf;
        uVar4 = (el->el_search).patlen;
        local_5c = L']';
        pwVar12 = pwVar15 + uVar4;
        do {
          pwVar12 = pwVar12 + -1;
          wVar11 = local_5c;
          if ((pwVar12 < pwVar15 + 2) || (wVar11 = *pwVar12, wVar11 == L']')) break;
        } while (wVar11 != L'[');
        local_5c = wVar11;
        if ((2 < uVar4) && (local_5c != L'[')) {
          if ((bool)(bVar6 & dir_00 == dir)) {
            if (ce_inc_search_pchar == 1) {
              wVar11 = L'\x7fffffff';
              if (dir_00 == L'\x18') {
                wVar11 = L'\0';
              }
              (el->el_history).eventno = wVar11;
              eVar8 = hist_get(el);
              if (eVar8 == '\x06') {
                hist_get(el);
              }
              peVar16 = local_40;
              if (dir_00 == L'\x18') {
                peVar16 = (el_line_t *)ppwVar1;
              }
              pwVar12 = peVar16->buffer;
            }
            else {
              pwVar12 = (el->el_line).cursor + (ulong)(dir_00 != L'\x18') * 2 + -1;
            }
            (el->el_line).cursor = pwVar12;
          }
          pwVar12 = (el->el_search).patbuf;
          sVar3 = (el->el_search).patlen;
          (el->el_search).patlen = sVar3 + 1;
          pwVar12[sVar3] = L'.';
          (el->el_search).patlen = sVar3 + 2;
          pwVar12[sVar3 + 1] = L'*';
          pwVar12[sVar3 + 2] = L'\0';
          pwVar12 = (el->el_line).cursor;
          if (((pwVar12 < (el->el_line).buffer) || (*ppwVar1 < pwVar12)) ||
             (eVar8 = ce_search_line(el,dir_00), eVar8 == '\x06')) {
            (el->el_state).lastcmd = (el_action_t)dir_00;
            if (dir_00 == L'\x18') {
              eVar8 = ed_search_prev_history(el,0);
            }
            else {
              eVar8 = ed_search_next_history(el,0);
            }
            if (eVar8 == '\x06') {
              sVar3 = (el->el_search).patlen;
              (el->el_search).patlen = sVar3 - 2;
              (el->el_search).patbuf[sVar3 - 2] = L'\0';
              terminal_beep(el);
              if ((el->el_history).eventno != local_54) {
                (el->el_history).eventno = local_54;
                eVar8 = hist_get(el);
                if (eVar8 == '\x06') goto LAB_0010f309;
              }
              (el->el_line).cursor = local_50;
              ce_inc_search_pchar = 1;
              goto LAB_0010f202;
            }
            (el->el_line).cursor =
                 *(wchar_t **)
                  ((long)((el->el_tty).t_t + -2) + 0x20 + (ulong)(dir_00 == L'\x18') * 0x10);
            ce_search_line(el,dir_00);
          }
          sVar3 = (el->el_search).patlen;
          (el->el_search).patlen = sVar3 - 2;
          (el->el_search).patbuf[sVar3 - 2] = L'\0';
          ce_inc_search_pchar = 0;
        }
LAB_0010f202:
        eVar9 = ce_inc_search(el,dir_00);
        eVar8 = '\0';
        if ((bVar7 & 1) != 0) {
          eVar8 = eVar9;
        }
        if ((ce_inc_search_pchar & 1) == 0) {
          eVar8 = eVar9;
        }
        if (eVar9 != '\x06') {
          eVar8 = eVar9;
        }
      }
      if ((eVar8 == '\0') || (local_38 == 0 && eVar8 == '\x06')) {
        ce_inc_search_pchar = bVar7 & 1;
        (el->el_search).patlen = local_38;
        if ((el->el_history).eventno != local_54) {
          (el->el_history).eventno = local_54;
          eVar9 = hist_get(el);
          if (eVar9 == '\x06') goto LAB_0010f309;
        }
        (el->el_line).cursor = local_50;
        if (eVar8 == '\x06') {
          re_refresh(el);
        }
      }
    } while ((bool)(~bVar5 & eVar8 == '\0'));
  }
  else {
LAB_0010f309:
    eVar8 = '\x06';
  }
  return eVar8;
}

Assistant:

libedit_private el_action_t
ce_inc_search(EditLine *el, int dir)
{
	static const wchar_t STRfwd[] = L"fwd", STRbck[] = L"bck";
	static wchar_t pchar = L':';  /* ':' = normal, '?' = failed */
	static wchar_t endcmd[2] = {'\0', '\0'};
	wchar_t *ocursor = el->el_line.cursor, oldpchar = pchar, ch;
	const wchar_t *cp;

	el_action_t ret = CC_NORM;

	int ohisteventno = el->el_history.eventno;
	size_t oldpatlen = el->el_search.patlen;
	int newdir = dir;
	int done, redo;

	if (el->el_line.lastchar + sizeof(STRfwd) /
	    sizeof(*el->el_line.lastchar) + 2 +
	    el->el_search.patlen >= el->el_line.limit)
		return CC_ERROR;

	for (;;) {

		if (el->el_search.patlen == 0) {	/* first round */
			pchar = ':';
#ifdef ANCHOR
#define	LEN	2
			el->el_search.patbuf[el->el_search.patlen++] = '.';
			el->el_search.patbuf[el->el_search.patlen++] = '*';
#else
#define	LEN	0
#endif
		}
		done = redo = 0;
		*el->el_line.lastchar++ = '\n';
		for (cp = (newdir == ED_SEARCH_PREV_HISTORY) ? STRbck : STRfwd;
		    *cp; *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar++ = pchar;
		for (cp = &el->el_search.patbuf[LEN];
		    cp < &el->el_search.patbuf[el->el_search.patlen];
		    *el->el_line.lastchar++ = *cp++)
			continue;
		*el->el_line.lastchar = '\0';
		re_refresh(el);

		if (el_wgetc(el, &ch) != 1)
			return ed_end_of_file(el, 0);

		switch (el->el_map.current[(unsigned char) ch]) {
		case ED_INSERT:
		case ED_DIGIT:
			if (el->el_search.patlen >= EL_BUFSIZ - LEN)
				terminal_beep(el);
			else {
				el->el_search.patbuf[el->el_search.patlen++] =
				    ch;
				*el->el_line.lastchar++ = ch;
				*el->el_line.lastchar = '\0';
				re_refresh(el);
			}
			break;

		case EM_INC_SEARCH_NEXT:
			newdir = ED_SEARCH_NEXT_HISTORY;
			redo++;
			break;

		case EM_INC_SEARCH_PREV:
			newdir = ED_SEARCH_PREV_HISTORY;
			redo++;
			break;

		case EM_DELETE_PREV_CHAR:
		case ED_DELETE_PREV_CHAR:
			if (el->el_search.patlen > LEN)
				done++;
			else
				terminal_beep(el);
			break;

		default:
			switch (ch) {
			case 0007:	/* ^G: Abort */
				ret = CC_ERROR;
				done++;
				break;

			case 0027:	/* ^W: Append word */
			/* No can do if globbing characters in pattern */
				for (cp = &el->el_search.patbuf[LEN];; cp++)
				    if (cp >= &el->el_search.patbuf[
					el->el_search.patlen]) {
					if (el->el_line.cursor ==
					    el->el_line.buffer)
						break;
					el->el_line.cursor +=
					    el->el_search.patlen - LEN - 1;
					cp = c__next_word(el->el_line.cursor,
					    el->el_line.lastchar, 1,
					    ce__isword);
					while (el->el_line.cursor < cp &&
					    *el->el_line.cursor != '\n') {
						if (el->el_search.patlen >=
						    EL_BUFSIZ - LEN) {
							terminal_beep(el);
							break;
						}
						el->el_search.patbuf[el->el_search.patlen++] =
						    *el->el_line.cursor;
						*el->el_line.lastchar++ =
						    *el->el_line.cursor++;
					}
					el->el_line.cursor = ocursor;
					*el->el_line.lastchar = '\0';
					re_refresh(el);
					break;
				    } else if (isglob(*cp)) {
					    terminal_beep(el);
					    break;
				    }
				break;

			default:	/* Terminate and execute cmd */
				endcmd[0] = ch;
				el_wpush(el, endcmd);
				/* FALLTHROUGH */

			case 0033:	/* ESC: Terminate */
				ret = CC_REFRESH;
				done++;
				break;
			}
			break;
		}

		while (el->el_line.lastchar > el->el_line.buffer &&
		    *el->el_line.lastchar != '\n')
			*el->el_line.lastchar-- = '\0';
		*el->el_line.lastchar = '\0';

		if (!done) {

			/* Can't search if unmatched '[' */
			for (cp = &el->el_search.patbuf[el->el_search.patlen-1],
			    ch = L']';
			    cp >= &el->el_search.patbuf[LEN];
			    cp--)
				if (*cp == '[' || *cp == ']') {
					ch = *cp;
					break;
				}
			if (el->el_search.patlen > LEN && ch != L'[') {
				if (redo && newdir == dir) {
					if (pchar == '?') { /* wrap around */
						el->el_history.eventno =
						    newdir == ED_SEARCH_PREV_HISTORY ? 0 : 0x7fffffff;
						if (hist_get(el) == CC_ERROR)
							/* el->el_history.event
							 * no was fixed by
							 * first call */
							(void) hist_get(el);
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
					} else
						el->el_line.cursor +=
						    newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    -1 : 1;
				}
#ifdef ANCHOR
				el->el_search.patbuf[el->el_search.patlen++] =
				    '.';
				el->el_search.patbuf[el->el_search.patlen++] =
				    '*';
#endif
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (el->el_line.cursor < el->el_line.buffer ||
				    el->el_line.cursor > el->el_line.lastchar ||
				    (ret = ce_search_line(el, newdir))
				    == CC_ERROR) {
					/* avoid c_setpat */
					el->el_state.lastcmd =
					    (el_action_t) newdir;
					ret = (el_action_t)
					    (newdir == ED_SEARCH_PREV_HISTORY ?
					    ed_search_prev_history(el, 0) :
					    ed_search_next_history(el, 0));
					if (ret != CC_ERROR) {
						el->el_line.cursor = newdir ==
						    ED_SEARCH_PREV_HISTORY ?
						    el->el_line.lastchar :
						    el->el_line.buffer;
						(void) ce_search_line(el,
						    newdir);
					}
				}
				el->el_search.patlen -= LEN;
				el->el_search.patbuf[el->el_search.patlen] =
				    '\0';
				if (ret == CC_ERROR) {
					terminal_beep(el);
					if (el->el_history.eventno !=
					    ohisteventno) {
						el->el_history.eventno =
						    ohisteventno;
						if (hist_get(el) == CC_ERROR)
							return CC_ERROR;
					}
					el->el_line.cursor = ocursor;
					pchar = '?';
				} else {
					pchar = ':';
				}
			}
			ret = ce_inc_search(el, newdir);

			if (ret == CC_ERROR && pchar == '?' && oldpchar == ':')
				/*
				 * break abort of failed search at last
				 * non-failed
				 */
				ret = CC_NORM;

		}
		if (ret == CC_NORM || (ret == CC_ERROR && oldpatlen == 0)) {
			/* restore on normal return or error exit */
			pchar = oldpchar;
			el->el_search.patlen = oldpatlen;
			if (el->el_history.eventno != ohisteventno) {
				el->el_history.eventno = ohisteventno;
				if (hist_get(el) == CC_ERROR)
					return CC_ERROR;
			}
			el->el_line.cursor = ocursor;
			if (ret == CC_ERROR)
				re_refresh(el);
		}
		if (done || ret != CC_NORM)
			return ret;
	}
}